

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_23a87f::WriterThread::run(WriterThread *this)

{
  double dVar1;
  Lock lock;
  Lock local_38;
  
  IlmThread_2_5::Semaphore::post();
  while( true ) {
    local_38._mutex = (Mutex *)(anonymous_namespace)::scanlineMutex;
    local_38._locked = false;
    std::mutex::lock((mutex *)(anonymous_namespace)::scanlineMutex);
    local_38._locked = true;
    if ((anonymous_namespace)::remainingScanlines == 0) break;
    dVar1 = Imath_2_5::Rand48::nextf
                      ((Rand48 *)&(anonymous_namespace)::rand1,0.0,
                       (double)(anonymous_namespace)::remainingScanlines);
    Imf_2_5::RgbaOutputFile::writePixels(this->_outfile,(int)(dVar1 + 0.5));
    (anonymous_namespace)::remainingScanlines =
         (anonymous_namespace)::remainingScanlines - (int)(dVar1 + 0.5);
    IlmThread_2_5::Lock::~Lock(&local_38);
  }
  IlmThread_2_5::Lock::~Lock(&local_38);
  return;
}

Assistant:

void
WriterThread::run ()
{
    //
    // Signal that the thread has started
    //

    threadSemaphore.post();

    while (true)
    {
	Lock lock (scanlineMutex);

	if (remainingScanlines)
	{
	    int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
	    _outfile->writePixels (n);
	    remainingScanlines -= n;
	}
	else
	{
	    break;
	}
    }
}